

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

Vec4 __thiscall
gl4cts::TextureViewTestViewSampling::getRandomReferenceColor(TextureViewTestViewSampling *this)

{
  Vec4 *result;
  undefined1 auVar1 [16];
  Vec4 VVar2;
  
  VVar2.m_data[2] = (getRandomReferenceColor::seed / 0xff) * 0x100;
  VVar2.m_data[3] = ((getRandomReferenceColor::seed * 8) / 0xff) * 0x100;
  auVar1._0_4_ = (float)(getRandomReferenceColor::seed % 0xff);
  auVar1._4_4_ = (float)((getRandomReferenceColor::seed * 8) % 0xff);
  auVar1._8_4_ = (float)((getRandomReferenceColor::seed * 0x10) % 0xff);
  auVar1._12_4_ = (float)((getRandomReferenceColor::seed * 0x20) % 0xff);
  auVar1 = divps(auVar1,_DAT_01a9ab80);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)auVar1._0_8_;
  (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)auVar1._8_8_;
  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
  VVar2.m_data._0_8_ = auVar1._0_8_;
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 TextureViewTestViewSampling::getRandomReferenceColor()
{
	static unsigned int seed = 195;
	tcu::Vec4			result;

	result = tcu::Vec4(float((seed) % 255) / 255.0f, float((seed << 3) % 255) / 255.0f,
					   float((seed << 4) % 255) / 255.0f, float((seed << 5) % 255) / 255.0f);

	seed += 17;

	return result;
}